

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctpl.h
# Opt level: O2

void __thiscall ctpl::thread_pool::set_thread(thread_pool *this,int i)

{
  pointer puVar1;
  thread *this_00;
  shared_ptr<std::atomic<bool>_> flag;
  anon_class_32_3_6b467476_for__M_head_impl f;
  
  std::__shared_ptr<std::atomic<bool>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&flag.super___shared_ptr<std::atomic<bool>,_(__gnu_cxx::_Lock_policy)2>,
             &(this->flags).
              super__Vector_base<std::shared_ptr<std::atomic<bool>_>,_std::allocator<std::shared_ptr<std::atomic<bool>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[i].
              super___shared_ptr<std::atomic<bool>,_(__gnu_cxx::_Lock_policy)2>);
  f.this = this;
  f.i = i;
  std::__shared_ptr<std::atomic<bool>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&f.flag.super___shared_ptr<std::atomic<bool>,_(__gnu_cxx::_Lock_policy)2>,
             &flag.super___shared_ptr<std::atomic<bool>,_(__gnu_cxx::_Lock_policy)2>);
  puVar1 = (this->threads).
           super__Vector_base<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>,_std::allocator<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this_00 = (thread *)operator_new(8);
  std::thread::thread<ctpl::thread_pool::set_thread(int)::_lambda()_1_&,,void>(this_00,&f);
  std::__uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>::reset
            ((__uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_> *)(puVar1 + i),this_00
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&f.flag.super___shared_ptr<std::atomic<bool>,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&flag.super___shared_ptr<std::atomic<bool>,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void set_thread(int i) {
            std::shared_ptr<std::atomic<bool>> flag(this->flags[i]);  // a copy of the shared ptr to the flag
            auto f = [this, i, flag/* a copy of the shared ptr to the flag */]() {
                std::atomic<bool>& _flag = *flag;
                std::function<void(int id)>* _f;
                bool isPop = this->q.pop(_f);
                while (true) {
                    while (isPop) {  // if there is anything in the queue
                        std::unique_ptr<std::function<void(int id)>> func(_f);  // at return, delete the function even if an exception occurred
                        (*_f)(i);

                        if (_flag)
                            return;  // the thread is wanted to stop, return even if the queue is not empty yet
                        else
                            isPop = this->q.pop(_f);
                    }

                    // the queue is empty here, wait for the next command
                    std::unique_lock<std::mutex> lock(this->mutex);
                    ++this->nWaiting;
                    this->cv.wait(lock, [this, &_f, &isPop, &_flag]() { isPop = this->q.pop(_f); return isPop || this->isDone || _flag; });
                    --this->nWaiting;

                    if (!isPop)
                        return;  // if the queue is empty and this->isDone == true or *flag then return
                }
            };
            this->threads[i].reset(new std::thread(f));  // compiler may not support std::make_unique()
        }